

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.cpp
# Opt level: O3

void TestFail(char *expval,char *val,char *file,int line,char *func)

{
  printf("VALUE:\n%s");
  putchar(10);
  printf("EXPECTED:\n%s",expval);
  putchar(10);
  if (func == (char *)0x0) {
    printf("%s(%d): error: expected %s but was %s",file,(ulong)(uint)line,expval,val);
  }
  else {
    printf("%s(%d): error: Failure in %s: expected %s but was %s",file,(ulong)(uint)line,func,expval
           ,val);
  }
  putchar(10);
  testing_fails = testing_fails + 1;
  if (fail_listener_ != (TestFailEventListener)0x0) {
    (*fail_listener_)(expval,val,file,line,func);
    return;
  }
  return;
}

Assistant:

void TestFail(const char *expval, const char *val, const char *file, int line, const char *func)
  {
  TEST_OUTPUT_LINE("VALUE:\n%s", val);
  TEST_OUTPUT_LINE("EXPECTED:\n%s", expval);
  if (func)
    {
    TEST_OUTPUT_LINE("%s(%d): error: Failure in %s: expected %s but was %s", file, line, func, expval, val);
    }
  else
    {
    TEST_OUTPUT_LINE("%s(%d): error: expected %s but was %s", file, line, expval, val);
    }
  ++testing_fails;

  // Notify, emulate 'gtest::OnTestPartResult' event handler.
  if (fail_listener_)
    (*fail_listener_)(expval, val, file, line, func);

  //assert(0);  // ignored in Release if NDEBUG defined
  }